

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_import.cpp
# Opt level: O2

void __thiscall
ComponentImport_multipleImportAndParse_Test::TestBody
          (ComponentImport_multipleImportAndParse_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  unsigned_long local_110;
  string a;
  unsigned_long local_e8;
  AssertionResult gtest_ar;
  ModelPtr model;
  ParserPtr parser;
  ModelPtr m;
  ComponentPtr c3;
  ComponentPtr c2;
  ComponentPtr c1;
  ImportSourcePtr imp;
  PrinterPtr printer;
  ImportSourcePtr imp2;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n    <component component_ref=\"cc1\" name=\"c1\"/>\n    <component component_ref=\"cc2\" name=\"c2\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n    <component component_ref=\"cc1\" name=\"c3\"/>\n  </import>\n</model>\n"
             ,(allocator<char> *)&a);
  libcellml::Model::create();
  libcellml::ImportSource::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"some-other-model.xml",(allocator<char> *)&gtest_ar);
  libcellml::ImportSource::setUrl
            ((string *)
             imp.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  libcellml::Component::create();
  peVar1 = c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"c1",(allocator<char> *)&gtest_ar)
  ;
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"cc1",(allocator<char> *)&gtest_ar);
  libcellml::Component::setSourceComponent
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&imp);
  std::__cxx11::string::~string((string *)&a);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Component::create();
  peVar1 = c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"c2",(allocator<char> *)&gtest_ar)
  ;
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"cc2",(allocator<char> *)&gtest_ar);
  libcellml::Component::setSourceComponent
            ((shared_ptr *)
             c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&imp);
  std::__cxx11::string::~string((string *)&a);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::ImportSource::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"some-other-model.xml",(allocator<char> *)&gtest_ar);
  libcellml::ImportSource::setUrl
            ((string *)
             imp2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  libcellml::Component::create();
  peVar1 = c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"c3",(allocator<char> *)&gtest_ar)
  ;
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"cc1",(allocator<char> *)&gtest_ar);
  libcellml::Component::setSourceComponent
            ((shared_ptr *)
             c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&imp2);
  std::__cxx11::string::~string((string *)&a);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","a",&e,&a);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&parser);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&model,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&model,(Message *)&parser);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&model);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&parser);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  local_110 = 3;
  local_e8 = libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(3)","model->componentCount()",&local_110,&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_110);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_110);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&gtest_ar,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  std::__cxx11::string::operator=((string *)&a,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","a",&e,&a);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_110);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_110);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&imp2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&imp.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(ComponentImport, multipleImportAndParse)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"cc1\" name=\"c1\"/>\n"
        "    <component component_ref=\"cc2\" name=\"c2\"/>\n"
        "  </import>\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"cc1\" name=\"c3\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("some-other-model.xml");
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    c1->setName("c1");
    c1->setSourceComponent(imp, "cc1");
    m->addComponent(c1);
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    c2->setName("c2");
    c2->setSourceComponent(imp, "cc2");
    m->addComponent(c2);

    // These have the same URL but a different ImportSource object, so should be separated.
    libcellml::ImportSourcePtr imp2 = libcellml::ImportSource::create();
    imp2->setUrl("some-other-model.xml");
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    c3->setName("c3");
    c3->setSourceComponent(imp2, "cc1");
    m->addComponent(c3);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);

    // Parse
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    EXPECT_EQ(size_t(3), model->componentCount());
    a = printer->printModel(model);
    EXPECT_EQ(e, a);
}